

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  int iVar1;
  size_t sVar2;
  xmlChar *str;
  xmlBufPtr pxVar3;
  size_t sVar4;
  int local_30;
  uint use;
  int nbchars;
  int res;
  char *buffer;
  int len_local;
  xmlParserInputBufferPtr in_local;
  
  if ((in == (xmlParserInputBufferPtr)0x0) || (in->error != 0)) {
    in_local._4_4_ = -1;
  }
  else {
    buffer._4_4_ = len;
    if ((len < 0xfa1) && (len != 4)) {
      buffer._4_4_ = 4000;
    }
    sVar2 = xmlBufAvail(in->buffer);
    if (sVar2 == 0) {
      xmlIOErr(0x60c,(char *)0x0);
      in->error = 0x60c;
      in_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlBufGrow(in->buffer,buffer._4_4_ + 1);
      if (iVar1 < 0) {
        xmlIOErrMemory("growing input buffer");
        in->error = 2;
        in_local._4_4_ = -1;
      }
      else {
        str = xmlBufEnd(in->buffer);
        if (in->readcallback == (xmlInputReadCallback)0x0) {
          xmlIOErr(0x60b,(char *)0x0);
          in->error = 0x60b;
          in_local._4_4_ = -1;
        }
        else {
          local_30 = (*in->readcallback)(in->context,(char *)str,buffer._4_4_);
          if (local_30 < 1) {
            in->readcallback = endOfInput;
          }
          if (local_30 < 0) {
            in_local._4_4_ = -1;
          }
          else {
            if ((in->compressed == -1) && (in->readcallback == xmlXzfileRead)) {
              iVar1 = __libxml2_xzcompressed(in->context);
              in->compressed = iVar1;
            }
            if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
              xmlBufAddLen(in->buffer,(long)local_30);
            }
            else {
              if (in->raw == (xmlBufPtr)0x0) {
                pxVar3 = xmlBufCreate();
                in->raw = pxVar3;
              }
              iVar1 = xmlBufAdd(in->raw,str,local_30);
              if (iVar1 != 0) {
                return -1;
              }
              sVar2 = xmlBufUse(in->raw);
              local_30 = xmlCharEncInput(in,1);
              if (local_30 < 0) {
                xmlIOErr(0x608,(char *)0x0);
                in->error = 0x608;
                return -1;
              }
              sVar4 = xmlBufUse(in->raw);
              in->rawconsumed = ((sVar2 & 0xffffffff) - sVar4) + in->rawconsumed;
            }
            in_local._4_4_ = local_30;
          }
        }
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    char *buffer = NULL;
    int res = 0;
    int nbchars = 0;

    if ((in == NULL) || (in->error)) return(-1);
    if ((len <= MINLEN) && (len != 4))
        len = MINLEN;

    if (xmlBufAvail(in->buffer) <= 0) {
	xmlIOErr(XML_IO_BUFFER_FULL, NULL);
	in->error = XML_IO_BUFFER_FULL;
	return(-1);
    }

    if (xmlBufGrow(in->buffer, len + 1) < 0) {
        xmlIOErrMemory("growing input buffer");
        in->error = XML_ERR_NO_MEMORY;
        return(-1);
    }
    buffer = (char *)xmlBufEnd(in->buffer);

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
	res = in->readcallback(in->context, &buffer[0], len);
	if (res <= 0)
	    in->readcallback = endOfInput;
    } else {
	xmlIOErr(XML_IO_NO_INPUT, NULL);
	in->error = XML_IO_NO_INPUT;
	return(-1);
    }
    if (res < 0) {
	return(-1);
    }

    /*
     * try to establish compressed status of input if not done already
     */
    if (in->compressed == -1) {
#ifdef LIBXML_LZMA_ENABLED
	if (in->readcallback == xmlXzfileRead)
            in->compressed = __libxml2_xzcompressed(in->context);
#endif
    }

    len = res;
    if (in->encoder != NULL) {
        unsigned int use;

        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate();
	}
	res = xmlBufAdd(in->raw, (const xmlChar *) buffer, len);
	if (res != 0)
	    return(-1);

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
	use = xmlBufUse(in->raw);
	nbchars = xmlCharEncInput(in, 1);
	if (nbchars < 0) {
	    xmlIOErr(XML_IO_ENCODER, NULL);
	    in->error = XML_IO_ENCODER;
	    return(-1);
	}
	in->rawconsumed += (use - xmlBufUse(in->raw));
    } else {
	nbchars = len;
        xmlBufAddLen(in->buffer, nbchars);
    }
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: read %d chars, buffer %d\n",
            nbchars, xmlBufUse(in->buffer));
#endif
    return(nbchars);
}